

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dired.c
# Opt level: O2

int gotofile(char *fpth)

{
  line *plVar1;
  mgwin *pmVar2;
  int iVar3;
  char *__s2;
  buffer *pbVar4;
  line *lp;
  int iVar5;
  bool bVar6;
  char local_438 [8];
  char fname [1024];
  
  xbasename(local_438,fpth,0x400);
  pbVar4 = curbp;
  plVar1 = curbp->b_headp;
  iVar5 = 1;
  lp = plVar1;
  do {
    lp = lp->l_fp;
    if (lp == plVar1) {
LAB_0011d07e:
      bVar6 = pbVar4->b_lines != iVar5;
      if (bVar6) {
        eerase();
      }
      else {
        ewprintf("File not found %s",local_438);
      }
      return (uint)bVar6;
    }
    __s2 = findfname(lp,fpth);
    if (__s2 != (char *)0x0) {
      iVar3 = strcmp(local_438,__s2);
      pmVar2 = curwp;
      fpth = __s2;
      if (iVar3 == 0) {
        curwp->w_dotp = lp;
        pmVar2->w_dotline = iVar5;
        d_warpdot(lp,&pmVar2->w_doto);
        pbVar4 = curbp;
        goto LAB_0011d07e;
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

int
gotofile(char *fpth)
{
	struct line	*lp, *nlp;
	char		 fname[NFILEN];
	char		*p;
	int		 tmp;

	(void)xbasename(fname, fpth, NFILEN);
	tmp = 0;
	for (lp = bfirstlp(curbp); lp != curbp->b_headp; lp = nlp) {
		tmp++;
		if ((p = findfname(lp, p)) == NULL) {
			nlp = lforw(lp);
			continue;
		}
		if (strcmp(fname, p) == 0) {
			curwp->w_dotp = lp;
			curwp->w_dotline = tmp;
			(void)d_warpdot(curwp->w_dotp, &curwp->w_doto);
			tmp--;
			break;
		}
		nlp = lforw(lp);
	}
	if (tmp == curbp->b_lines - 1) {
		ewprintf("File not found %s", fname);
		return (FALSE);
	} else {
		eerase();
		return (TRUE);
	}
}